

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void WriteVars(FSerializer *file,SDWORD *vars,size_t count,char *key)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (count != 0) {
    uVar4 = 0;
    do {
      if (vars[uVar4] != 0) {
        uVar2 = count - 1;
        uVar5 = uVar2;
        if (uVar4 < uVar2) {
          uVar5 = uVar4;
        }
        goto LAB_003b0514;
      }
      uVar4 = uVar4 + 1;
    } while (count != uVar4);
  }
  return;
  while (uVar2 = uVar3 - 1, uVar1 = uVar3, vars[uVar3] == 0) {
LAB_003b0514:
    uVar3 = uVar2;
    uVar1 = uVar5;
    if (uVar3 <= uVar4) break;
  }
  FSerializer::Array<int>(file,key,vars,(int)uVar1 + 1,false);
  return;
}

Assistant:

static void WriteVars (FSerializer &file, SDWORD *vars, size_t count, const char *key)
{
	size_t i, j;

	for (i = 0; i < count; ++i)
	{
		if (vars[i] != 0)
			break;
	}
	if (i < count)
	{
		// Find last non-zero var. Anything beyond the last stored variable
		// will be zeroed at load time.
		for (j = count-1; j > i; --j)
		{
			if (vars[j] != 0)
				break;
		}
		file.Array(key, vars, int(j+1));
	}
}